

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

uint32_t __thiscall cfd::Psbt::GetTxInIndex(Psbt *this,OutPoint *outpoint)

{
  uint32_t uVar1;
  Txid local_30;
  
  core::OutPoint::GetTxid(&local_30,outpoint);
  uVar1 = core::OutPoint::GetVout(outpoint);
  uVar1 = core::Transaction::GetTxInIndex(&(this->super_Psbt).base_tx_,&local_30,uVar1);
  local_30._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_30.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t Psbt::GetTxInIndex(const OutPoint& outpoint) const {
  return base_tx_.GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}